

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O0

CompilationUnitSymbol * __thiscall slang::ast::Scope::getCompilationUnit(Scope *this)

{
  Symbol *pSVar1;
  Scope *in_RDI;
  bool bVar2;
  Scope *currScope;
  Scope *local_18;
  CompilationUnitSymbol *local_8;
  
  local_18 = in_RDI;
  while( true ) {
    bVar2 = false;
    if (local_18 != (Scope *)0x0) {
      pSVar1 = asSymbol(local_18);
      bVar2 = pSVar1->kind != CompilationUnit;
    }
    if (!bVar2) break;
    pSVar1 = asSymbol(local_18);
    local_18 = Symbol::getParentScope(pSVar1);
  }
  if (local_18 == (Scope *)0x0) {
    local_8 = (CompilationUnitSymbol *)0x0;
  }
  else {
    asSymbol(local_18);
    local_8 = Symbol::as<slang::ast::CompilationUnitSymbol>((Symbol *)0x9014d2);
  }
  return local_8;
}

Assistant:

const CompilationUnitSymbol* Scope::getCompilationUnit() const {
    auto currScope = this;
    while (currScope && currScope->asSymbol().kind != SymbolKind::CompilationUnit)
        currScope = currScope->asSymbol().getParentScope();

    if (currScope)
        return &currScope->asSymbol().as<CompilationUnitSymbol>();

    return nullptr;
}